

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basicGenerators.h
# Opt level: O3

Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>
* __thiscall
LazyCode::read<int,std::ifstream>
          (Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>
           *__return_storage_ptr__,LazyCode *this,
          basic_ifstream<char,_std::char_traits<char>_> *stream)

{
  ifstream aiStack_238 [520];
  istream_type *local_30;
  int local_28;
  bool local_24;
  istream_type *local_20;
  int local_18;
  bool local_14;
  
  read<int,std::ifstream>(std::ifstream&&)::Reader::Reader(std::ifstream___
            (aiStack_238,(basic_ifstream<char,_std::char_traits<char>_> *)this);
  std::ifstream::ifstream(__return_storage_ptr__,aiStack_238);
  (__return_storage_ptr__->member).first._M_stream = local_30;
  (__return_storage_ptr__->member).first._M_value = local_28;
  (__return_storage_ptr__->member).first._M_ok = local_24;
  (__return_storage_ptr__->member).last._M_stream = local_20;
  (__return_storage_ptr__->member).last._M_value = local_18;
  (__return_storage_ptr__->member).last._M_ok = local_14;
  std::ifstream::~ifstream(aiStack_238);
  return __return_storage_ptr__;
}

Assistant:

auto read(Stream&& stream) {
    struct Reader {
        Stream stream;
        std::istream_iterator<ReadType> first;
        std::istream_iterator<ReadType> last;
        Reader(Stream&& stream)
            : stream(std::forward<Stream>(stream)), first(this->stream) {}
    };
    return generator(Reader(std::forward<Stream>(stream)),
                     [](auto&& reader) mutable -> optional<ReadType> {
                         if (reader.first == reader.last) {
                             return nullopt;
                         }
                         decltype(auto) val = *reader.first;
                         ++reader.first;
                         return val;
                     });
}